

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  BYTE *pBVar1;
  seqDef *psVar2;
  int iVar3;
  bool bVar4;
  undefined8 uVar5;
  seqStore_t *psVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  BYTE *pBVar11;
  ulong uVar12;
  U32 UVar13;
  uint uVar14;
  BYTE *pBVar15;
  uint uVar16;
  BYTE *pBVar17;
  U32 UVar18;
  int *piVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  int *piVar23;
  int iVar24;
  size_t sVar25;
  U32 maxDistance;
  size_t offsetFound;
  BYTE *litLimit_w;
  int *local_c0;
  size_t local_b8;
  size_t local_98;
  int *local_90;
  BYTE *local_88;
  int *local_80;
  ulong local_78;
  BYTE *local_70;
  BYTE *local_68;
  uint local_5c;
  seqStore_t *local_58;
  BYTE *local_50;
  int *local_48;
  uint *local_40;
  BYTE *local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  local_80 = (int *)((long)src + (srcSize - 8));
  local_68 = (ms->window).base;
  uVar9 = (ms->window).dictLimit;
  uVar12 = (ulong)uVar9;
  local_88 = local_68 + uVar12;
  uVar16 = *rep;
  uVar14 = rep[1];
  piVar19 = (int *)((ulong)(local_88 == (BYTE *)src) + (long)src);
  local_90 = (int *)src;
  local_40 = rep;
  if (piVar19 < local_80) {
    local_70 = (ms->window).dictBase;
    local_50 = local_70 + uVar12;
    local_38 = local_70 + (ms->window).lowLimit;
    uVar7 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    iVar8 = uVar9 - 1;
    local_48 = (int *)(iEnd + -0x20);
    local_78 = uVar12;
    local_58 = seqStore;
    do {
      iVar24 = (int)piVar19 - (int)local_68;
      iVar22 = iVar24 + 1;
      UVar18 = (ms->window).lowLimit;
      UVar13 = iVar22 - uVar7;
      if (iVar22 - UVar18 <= uVar7) {
        UVar13 = UVar18;
      }
      if (ms->loadedDictEnd != 0) {
        UVar13 = UVar18;
      }
      uVar9 = iVar22 - uVar16;
      pBVar15 = local_68;
      if (uVar9 < (uint)uVar12) {
        pBVar15 = local_70;
      }
      local_5c = uVar14;
      if (iVar8 - uVar9 < 3) {
LAB_001ff5ec:
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        if (uVar16 < (iVar24 - UVar13) + 1) {
          if (*(int *)((long)piVar19 + 1) != *(int *)(pBVar15 + uVar9)) goto LAB_001ff5ec;
          pBVar11 = iEnd;
          if (uVar9 < (uint)uVar12) {
            pBVar11 = local_50;
          }
          sVar10 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar19 + 5),(BYTE *)((long)(pBVar15 + uVar9) + 4),iEnd
                              ,pBVar11,local_88);
          uVar20 = sVar10 + 4;
        }
      }
      local_98 = 999999999;
      sVar10 = ZSTD_BtFindBestMatch_extDict_selectMLS(ms,(BYTE *)piVar19,iEnd,&local_98);
      local_b8 = uVar20;
      if (uVar20 < sVar10) {
        local_b8 = sVar10;
      }
      if (local_b8 < 4) {
        piVar19 = (int *)((long)piVar19 + ((long)piVar19 - (long)local_90 >> 8) + 1);
        uVar12 = local_78;
        piVar23 = local_80;
        uVar14 = local_5c;
      }
      else {
        local_c0 = piVar19;
        sVar25 = local_98;
        if (sVar10 <= uVar20) {
          local_c0 = (int *)((long)piVar19 + 1);
          sVar25 = 0;
        }
        if (piVar19 < local_80) {
          do {
            piVar23 = (int *)((long)piVar19 + 1);
            iVar22 = iVar24 + 1;
            if (sVar25 == 0) {
              sVar25 = 0;
            }
            else {
              UVar18 = (ms->window).lowLimit;
              UVar13 = iVar22 - uVar7;
              if (iVar22 - UVar18 <= uVar7) {
                UVar13 = UVar18;
              }
              if (ms->loadedDictEnd != 0) {
                UVar13 = UVar18;
              }
              uVar9 = iVar22 - uVar16;
              pBVar15 = local_68;
              if (uVar9 < (uint)local_78) {
                pBVar15 = local_70;
              }
              if (((2 < iVar8 - uVar9) && (uVar16 < iVar22 - UVar13)) &&
                 (*piVar23 == *(int *)(pBVar15 + uVar9))) {
                pBVar11 = iEnd;
                if (uVar9 < (uint)local_78) {
                  pBVar11 = local_50;
                }
                sVar10 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar19 + 5),
                                    (BYTE *)((long)(pBVar15 + uVar9) + 4),iEnd,pBVar11,local_88);
                if (sVar10 < 0xfffffffffffffffc) {
                  uVar14 = (int)sVar25 + 1;
                  uVar9 = 0x1f;
                  if (uVar14 != 0) {
                    for (; uVar14 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                    }
                  }
                  if ((int)((uVar9 ^ 0x1f) + (int)local_b8 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                    sVar25 = 0;
                    local_c0 = piVar23;
                    local_b8 = sVar10 + 4;
                  }
                }
              }
            }
            local_98 = 999999999;
            sVar10 = ZSTD_BtFindBestMatch_extDict_selectMLS(ms,(BYTE *)piVar23,iEnd,&local_98);
            bVar4 = true;
            if (3 < sVar10) {
              uVar14 = (int)sVar25 + 1;
              uVar9 = 0x1f;
              if (uVar14 != 0) {
                for (; uVar14 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              uVar14 = (int)local_98 + 1;
              iVar3 = 0x1f;
              if (uVar14 != 0) {
                for (; uVar14 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)((uVar9 ^ 0x1f) + (int)local_b8 * 4 + -0x1b) < (int)sVar10 * 4 - iVar3) {
                bVar4 = false;
                sVar25 = local_98;
                local_c0 = piVar23;
                local_b8 = sVar10;
              }
            }
            if (bVar4) {
              if (local_80 <= piVar23) break;
              piVar23 = (int *)((long)piVar19 + 2);
              iVar22 = iVar24 + 2;
              if (sVar25 == 0) {
                sVar25 = 0;
              }
              else {
                UVar18 = (ms->window).lowLimit;
                UVar13 = iVar22 - uVar7;
                if (iVar22 - UVar18 <= uVar7) {
                  UVar13 = UVar18;
                }
                if (ms->loadedDictEnd != 0) {
                  UVar13 = UVar18;
                }
                uVar9 = iVar22 - uVar16;
                pBVar15 = local_68;
                if (uVar9 < (uint)local_78) {
                  pBVar15 = local_70;
                }
                if (((2 < iVar8 - uVar9) && (uVar16 < iVar22 - UVar13)) &&
                   (*piVar23 == *(int *)(pBVar15 + uVar9))) {
                  pBVar11 = iEnd;
                  if (uVar9 < (uint)local_78) {
                    pBVar11 = local_50;
                  }
                  sVar10 = ZSTD_count_2segments
                                     ((BYTE *)((long)piVar19 + 6),
                                      (BYTE *)((long)(pBVar15 + uVar9) + 4),iEnd,pBVar11,local_88);
                  if (sVar10 < 0xfffffffffffffffc) {
                    uVar14 = (int)sVar25 + 1;
                    uVar9 = 0x1f;
                    if (uVar14 != 0) {
                      for (; uVar14 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                      }
                    }
                    if ((int)((uVar9 ^ 0x1f) + (int)local_b8 * 4 + -0x1e) < (int)(sVar10 + 4) * 4) {
                      sVar25 = 0;
                      local_c0 = piVar23;
                      local_b8 = sVar10 + 4;
                    }
                  }
                }
              }
              local_98 = 999999999;
              sVar10 = ZSTD_BtFindBestMatch_extDict_selectMLS(ms,(BYTE *)piVar23,iEnd,&local_98);
              bVar4 = true;
              if (3 < sVar10) {
                uVar14 = (int)sVar25 + 1;
                uVar9 = 0x1f;
                if (uVar14 != 0) {
                  for (; uVar14 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                  }
                }
                uVar14 = (int)local_98 + 1;
                iVar24 = 0x1f;
                if (uVar14 != 0) {
                  for (; uVar14 >> iVar24 == 0; iVar24 = iVar24 + -1) {
                  }
                }
                if ((int)((uVar9 ^ 0x1f) + (int)local_b8 * 4 + -0x18) < (int)sVar10 * 4 - iVar24) {
                  bVar4 = false;
                  sVar25 = local_98;
                  local_c0 = piVar23;
                  local_b8 = sVar10;
                }
              }
              if (bVar4) break;
            }
            iVar24 = iVar22;
            piVar19 = piVar23;
          } while (piVar19 < local_80);
        }
        psVar6 = local_58;
        piVar23 = local_80;
        if (sVar25 == 0) {
          UVar18 = 1;
          uVar9 = uVar16;
          uVar14 = local_5c;
        }
        else {
          pBVar17 = (BYTE *)((long)local_c0 + (2 - (long)(local_68 + sVar25)));
          pBVar11 = local_88;
          pBVar15 = local_68;
          if ((uint)pBVar17 < (uint)local_78) {
            pBVar11 = local_38;
            pBVar15 = local_70;
          }
          if ((local_90 < local_c0) &&
             (uVar12 = (ulong)pBVar17 & 0xffffffff, pBVar11 < pBVar15 + uVar12)) {
            pBVar15 = pBVar15 + uVar12;
            do {
              pBVar15 = pBVar15 + -1;
              piVar19 = (int *)((long)local_c0 + -1);
              if ((*(BYTE *)piVar19 != *pBVar15) ||
                 (local_b8 = local_b8 + 1, local_c0 = piVar19, piVar19 <= local_90)) break;
            } while (pBVar11 < pBVar15);
          }
          UVar18 = (int)sVar25 + 1;
          uVar9 = (int)sVar25 - 2;
          uVar14 = uVar16;
        }
        uVar12 = (long)local_c0 - (long)local_90;
        if (local_48 < local_c0) {
          pBVar11 = local_58->lit;
          pBVar15 = pBVar11;
          piVar19 = local_90;
          if (local_90 <= local_48) {
            pBVar15 = pBVar11 + ((long)local_48 - (long)local_90);
            uVar5 = *(undefined8 *)(local_90 + 2);
            *(undefined8 *)pBVar11 = *(undefined8 *)local_90;
            *(undefined8 *)(pBVar11 + 8) = uVar5;
            piVar19 = local_48;
            if (0x10 < (long)local_48 - (long)local_90) {
              lVar21 = 0x10;
              do {
                uVar5 = *(undefined8 *)((BYTE *)((long)local_90 + lVar21) + 8);
                pBVar17 = pBVar11 + lVar21;
                *(undefined8 *)pBVar17 = *(undefined8 *)((long)local_90 + lVar21);
                *(undefined8 *)(pBVar17 + 8) = uVar5;
                pBVar1 = (BYTE *)((long)local_90 + lVar21 + 0x10);
                uVar5 = *(undefined8 *)(pBVar1 + 8);
                *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)pBVar1;
                *(undefined8 *)(pBVar17 + 0x18) = uVar5;
                lVar21 = lVar21 + 0x20;
              } while (pBVar17 + 0x20 < pBVar15);
            }
          }
          if (piVar19 < local_c0) {
            lVar21 = 0;
            do {
              pBVar15[lVar21] = *(BYTE *)((long)piVar19 + lVar21);
              lVar21 = lVar21 + 1;
            } while ((long)local_c0 - (long)piVar19 != lVar21);
          }
        }
        else {
          pBVar15 = local_58->lit;
          uVar5 = *(undefined8 *)(local_90 + 2);
          *(undefined8 *)pBVar15 = *(undefined8 *)local_90;
          *(undefined8 *)(pBVar15 + 8) = uVar5;
          if (0x10 < uVar12) {
            pBVar15 = local_58->lit;
            uVar5 = *(undefined8 *)(local_90 + 6);
            *(undefined8 *)(pBVar15 + 0x10) = *(undefined8 *)(local_90 + 4);
            *(undefined8 *)(pBVar15 + 0x18) = uVar5;
            if (0x20 < (long)uVar12) {
              lVar21 = 0;
              do {
                pBVar17 = (BYTE *)((long)local_90 + lVar21 + 0x20);
                uVar5 = *(undefined8 *)(pBVar17 + 8);
                pBVar11 = pBVar15 + lVar21 + 0x20;
                *(undefined8 *)pBVar11 = *(undefined8 *)pBVar17;
                *(undefined8 *)(pBVar11 + 8) = uVar5;
                pBVar17 = (BYTE *)((long)local_90 + lVar21 + 0x30);
                uVar5 = *(undefined8 *)(pBVar17 + 8);
                *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)pBVar17;
                *(undefined8 *)(pBVar11 + 0x18) = uVar5;
                lVar21 = lVar21 + 0x20;
              } while (pBVar11 + 0x20 < pBVar15 + uVar12);
            }
          }
        }
        local_58->lit = local_58->lit + uVar12;
        if (0xffff < uVar12) {
          local_58->longLengthType = ZSTD_llt_literalLength;
          local_58->longLengthPos =
               (U32)((ulong)((long)local_58->sequences - (long)local_58->sequencesStart) >> 3);
        }
        psVar2 = local_58->sequences;
        psVar2->litLength = (U16)uVar12;
        psVar2->offset = UVar18;
        if (0xffff < local_b8 - 3) {
          local_58->longLengthType = ZSTD_llt_matchLength;
          local_58->longLengthPos =
               (U32)((ulong)((long)psVar2 - (long)local_58->sequencesStart) >> 3);
        }
        psVar2->matchLength = (U16)(local_b8 - 3);
        local_58->sequences = psVar2 + 1;
        piVar19 = (int *)((long)local_c0 + local_b8);
        uVar12 = local_78;
        local_90 = piVar19;
        do {
          uVar16 = uVar9;
          if (piVar23 < piVar19) break;
          iVar22 = (int)piVar19 - (int)local_68;
          UVar18 = (ms->window).lowLimit;
          UVar13 = iVar22 - uVar7;
          if (iVar22 - UVar18 <= uVar7) {
            UVar13 = UVar18;
          }
          if (ms->loadedDictEnd != 0) {
            UVar13 = UVar18;
          }
          uVar16 = iVar22 - uVar14;
          pBVar15 = local_68;
          if (uVar16 < (uint)uVar12) {
            pBVar15 = local_70;
          }
          if (((iVar8 - uVar16 < 3) || (iVar22 - UVar13 <= uVar14)) ||
             (*piVar19 != *(int *)(pBVar15 + uVar16))) {
            bVar4 = false;
            uVar16 = uVar14;
          }
          else {
            pBVar11 = iEnd;
            if (uVar16 < (uint)uVar12) {
              pBVar11 = local_50;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar19 + 1),(BYTE *)((long)(pBVar15 + uVar16) + 4),iEnd,
                                pBVar11,local_88);
            if (local_90 <= local_48) {
              pBVar15 = psVar6->lit;
              uVar5 = *(undefined8 *)(local_90 + 2);
              *(undefined8 *)pBVar15 = *(undefined8 *)local_90;
              *(undefined8 *)(pBVar15 + 8) = uVar5;
            }
            psVar2 = psVar6->sequences;
            psVar2->litLength = 0;
            psVar2->offset = 1;
            if (0xffff < sVar10 + 1) {
              psVar6->longLengthType = ZSTD_llt_matchLength;
              psVar6->longLengthPos =
                   (U32)((ulong)((long)psVar2 - (long)psVar6->sequencesStart) >> 3);
            }
            psVar2->matchLength = (U16)(sVar10 + 1);
            psVar6->sequences = psVar2 + 1;
            piVar19 = (int *)((long)piVar19 + sVar10 + 4);
            bVar4 = true;
            uVar12 = local_78;
            uVar16 = uVar9;
            uVar9 = uVar14;
            local_90 = piVar19;
          }
          uVar14 = uVar16;
          uVar16 = uVar9;
        } while (bVar4);
      }
    } while (piVar19 < piVar23);
  }
  *local_40 = uVar16;
  local_40[1] = uVar14;
  return (long)iEnd - (long)local_90;
}

Assistant:

FORCE_INLINE_TEMPLATE
size_t ZSTD_compressBlock_lazy_extDict_generic(
                        ZSTD_matchState_t* ms, seqStore_t* seqStore,
                        U32 rep[ZSTD_REP_NUM],
                        const void* src, size_t srcSize,
                        const searchMethod_e searchMethod, const U32 depth)
{
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = searchMethod == search_rowHash ? iend - 8 - ZSTD_ROW_HASH_CACHE_SIZE : iend - 8;
    const BYTE* const base = ms->window.base;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictEnd  = dictBase + dictLimit;
    const BYTE* const dictStart  = dictBase + ms->window.lowLimit;
    const U32 windowLog = ms->cParams.windowLog;
    const U32 rowLog = ms->cParams.searchLog < 5 ? 4 : 5;

    typedef size_t (*searchMax_f)(
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* iLimit, size_t* offsetPtr);
    const searchMax_f searchFuncs[3] = {
        ZSTD_HcFindBestMatch_extDict_selectMLS,
        ZSTD_BtFindBestMatch_extDict_selectMLS,
        ZSTD_RowFindBestMatch_extDict_selectRowLog
    };
    searchMax_f searchMax = searchFuncs[(int)searchMethod];
    U32 offset_1 = rep[0], offset_2 = rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_lazy_extDict_generic (searchFunc=%u)", (U32)searchMethod);

    /* init */
    ip += (ip == prefixStart);
    if (searchMethod == search_rowHash) {
        ZSTD_row_fillHashCache(ms, base, rowLog,
                               MIN(ms->cParams.minMatch, 6 /* mls caps out at 6 */),
                               ms->nextToUpdate, ilimit);
    }

    /* Match Loop */
#if defined(__GNUC__) && defined(__x86_64__)
    /* I've measured random a 5% speed loss on levels 5 & 6 (greedy) when the
     * code alignment is perturbed. To fix the instability align the loop on 32-bytes.
     */
    __asm__(".p2align 5");
#endif
    while (ip < ilimit) {
        size_t matchLength=0;
        size_t offset=0;
        const BYTE* start=ip+1;
        U32 curr = (U32)(ip-base);

        /* check repCode */
        {   const U32 windowLow = ZSTD_getLowestMatchIndex(ms, curr+1, windowLog);
            const U32 repIndex = (U32)(curr+1 - offset_1);
            const BYTE* const repBase = repIndex < dictLimit ? dictBase : base;
            const BYTE* const repMatch = repBase + repIndex;
            if ( ((U32)((dictLimit-1) - repIndex) >= 3) /* intentional overflow */
               & (offset_1 < curr+1 - windowLow) ) /* note: we are searching at curr+1 */
            if (MEM_read32(ip+1) == MEM_read32(repMatch)) {
                /* repcode detected we should take it */
                const BYTE* const repEnd = repIndex < dictLimit ? dictEnd : iend;
                matchLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repEnd, prefixStart) + 4;
                if (depth==0) goto _storeSequence;
        }   }

        /* first search (depth 0) */
        {   size_t offsetFound = 999999999;
            size_t const ml2 = searchMax(ms, ip, iend, &offsetFound);
            if (ml2 > matchLength)
                matchLength = ml2, start = ip, offset=offsetFound;
        }

         if (matchLength < 4) {
            ip += ((ip-anchor) >> kSearchStrength) + 1;   /* jump faster over incompressible sections */
            continue;
        }

        /* let's try to find a better solution */
        if (depth>=1)
        while (ip<ilimit) {
            ip ++;
            curr++;
            /* check repCode */
            if (offset) {
                const U32 windowLow = ZSTD_getLowestMatchIndex(ms, curr, windowLog);
                const U32 repIndex = (U32)(curr - offset_1);
                const BYTE* const repBase = repIndex < dictLimit ? dictBase : base;
                const BYTE* const repMatch = repBase + repIndex;
                if ( ((U32)((dictLimit-1) - repIndex) >= 3) /* intentional overflow : do not test positions overlapping 2 memory segments  */
                   & (offset_1 < curr - windowLow) ) /* equivalent to `curr > repIndex >= windowLow` */
                if (MEM_read32(ip) == MEM_read32(repMatch)) {
                    /* repcode detected */
                    const BYTE* const repEnd = repIndex < dictLimit ? dictEnd : iend;
                    size_t const repLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd, prefixStart) + 4;
                    int const gain2 = (int)(repLength * 3);
                    int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offset+1) + 1);
                    if ((repLength >= 4) && (gain2 > gain1))
                        matchLength = repLength, offset = 0, start = ip;
            }   }

            /* search match, depth 1 */
            {   size_t offset2=999999999;
                size_t const ml2 = searchMax(ms, ip, iend, &offset2);
                int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)offset2+1));   /* raw approx */
                int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 4);
                if ((ml2 >= 4) && (gain2 > gain1)) {
                    matchLength = ml2, offset = offset2, start = ip;
                    continue;   /* search a better one */
            }   }

            /* let's find an even better one */
            if ((depth==2) && (ip<ilimit)) {
                ip ++;
                curr++;
                /* check repCode */
                if (offset) {
                    const U32 windowLow = ZSTD_getLowestMatchIndex(ms, curr, windowLog);
                    const U32 repIndex = (U32)(curr - offset_1);
                    const BYTE* const repBase = repIndex < dictLimit ? dictBase : base;
                    const BYTE* const repMatch = repBase + repIndex;
                    if ( ((U32)((dictLimit-1) - repIndex) >= 3) /* intentional overflow : do not test positions overlapping 2 memory segments  */
                       & (offset_1 < curr - windowLow) ) /* equivalent to `curr > repIndex >= windowLow` */
                    if (MEM_read32(ip) == MEM_read32(repMatch)) {
                        /* repcode detected */
                        const BYTE* const repEnd = repIndex < dictLimit ? dictEnd : iend;
                        size_t const repLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd, prefixStart) + 4;
                        int const gain2 = (int)(repLength * 4);
                        int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 1);
                        if ((repLength >= 4) && (gain2 > gain1))
                            matchLength = repLength, offset = 0, start = ip;
                }   }

                /* search match, depth 2 */
                {   size_t offset2=999999999;
                    size_t const ml2 = searchMax(ms, ip, iend, &offset2);
                    int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)offset2+1));   /* raw approx */
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 7);
                    if ((ml2 >= 4) && (gain2 > gain1)) {
                        matchLength = ml2, offset = offset2, start = ip;
                        continue;
            }   }   }
            break;  /* nothing found : store previous solution */
        }

        /* catch up */
        if (offset) {
            U32 const matchIndex = (U32)((start-base) - (offset - ZSTD_REP_MOVE));
            const BYTE* match = (matchIndex < dictLimit) ? dictBase + matchIndex : base + matchIndex;
            const BYTE* const mStart = (matchIndex < dictLimit) ? dictStart : prefixStart;
            while ((start>anchor) && (match>mStart) && (start[-1] == match[-1])) { start--; match--; matchLength++; }  /* catch up */
            offset_2 = offset_1; offset_1 = (U32)(offset - ZSTD_REP_MOVE);
        }

        /* store sequence */
_storeSequence:
        {   size_t const litLength = start - anchor;
            ZSTD_storeSeq(seqStore, litLength, anchor, iend, (U32)offset, matchLength-MINMATCH);
            anchor = ip = start + matchLength;
        }

        /* check immediate repcode */
        while (ip <= ilimit) {
            const U32 repCurrent = (U32)(ip-base);
            const U32 windowLow = ZSTD_getLowestMatchIndex(ms, repCurrent, windowLog);
            const U32 repIndex = repCurrent - offset_2;
            const BYTE* const repBase = repIndex < dictLimit ? dictBase : base;
            const BYTE* const repMatch = repBase + repIndex;
            if ( ((U32)((dictLimit-1) - repIndex) >= 3) /* intentional overflow : do not test positions overlapping 2 memory segments  */
               & (offset_2 < repCurrent - windowLow) ) /* equivalent to `curr > repIndex >= windowLow` */
            if (MEM_read32(ip) == MEM_read32(repMatch)) {
                /* repcode detected we should take it */
                const BYTE* const repEnd = repIndex < dictLimit ? dictEnd : iend;
                matchLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd, prefixStart) + 4;
                offset = offset_2; offset_2 = offset_1; offset_1 = (U32)offset;   /* swap offset history */
                ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, matchLength-MINMATCH);
                ip += matchLength;
                anchor = ip;
                continue;   /* faster when present ... (?) */
            }
            break;
    }   }

    /* Save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}